

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_c11_unittests.cc
# Opt level: O0

void __thiscall
DenseHashMapMoveTest_InsertDerivedKey_Test::~DenseHashMapMoveTest_InsertDerivedKey_Test
          (DenseHashMapMoveTest_InsertDerivedKey_Test *this)

{
  void *in_RDI;
  
  ~DenseHashMapMoveTest_InsertDerivedKey_Test
            ((DenseHashMapMoveTest_InsertDerivedKey_Test *)0x1095b48);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DenseHashMapMoveTest, InsertDerivedKey)
{
    dense_hash_map<A, int, HashA> h;
    h.set_empty_key(A(0));

    A::reset();
    h.insert(std::make_pair(B(2), 2));

    ASSERT_EQ(0, A::copy_ctor);
    ASSERT_EQ(0, A::copy_assign);
    ASSERT_EQ(2, A::move_ctor);
    ASSERT_EQ(0, A::move_assign);
}